

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  char cVar3;
  time_t tVar4;
  byte bVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  uchar uVar9;
  
  tVar4 = time((time_t *)0x0);
  srandom((uint)tVar4);
  memset(&greatest_info,0,0x170);
  greatest_info.width = 0x48;
  greatest_info.begin = clock();
  if (greatest_info.begin == -1) {
    pcVar6 = "greatest_info.begin";
LAB_00106948:
    fprintf(_stdout,"clock error: %s\n",pcVar6);
LAB_00106918:
    exit(1);
  }
  cVar3 = 'h';
  bVar5 = greatest_info.flags;
  uVar9 = greatest_info.verbosity;
  for (iVar8 = 1; iVar8 < argc; iVar8 = iVar8 + 1) {
    pcVar6 = argv[iVar8];
    cVar1 = *pcVar6;
    if (cVar1 != '-') {
      cVar3 = '-';
      cVar2 = cVar1;
LAB_00106779:
      if ((cVar3 == cVar2) || (iVar8 = strncmp("--help",pcVar6,6), iVar8 == 0)) {
        greatest_usage(*argv);
        exit(0);
      }
      if ((cVar1 != '-') || (pcVar6[1] != '-')) {
        fprintf(_stdout,"Unknown argument \'%s\'\n",pcVar6);
LAB_00106910:
        greatest_usage(*argv);
        goto LAB_00106918;
      }
      break;
    }
    cVar2 = pcVar6[1];
    if (cVar2 == 'f') {
      bVar5 = bVar5 | 1;
      greatest_info.flags = bVar5;
    }
    else if (cVar2 == 'l') {
      bVar5 = bVar5 | 2;
      greatest_info.flags = bVar5;
    }
    else if (cVar2 == 's') {
      iVar8 = iVar8 + 1;
      if (argc <= iVar8) goto LAB_00106910;
      greatest_info.suite_filter = argv[iVar8];
    }
    else if (cVar2 == 'v') {
      uVar9 = uVar9 + '\x01';
      greatest_info.verbosity = uVar9;
    }
    else {
      if (cVar2 != 't') goto LAB_00106779;
      iVar8 = iVar8 + 1;
      if (argc <= iVar8) goto LAB_00106910;
      greatest_info.test_filter = argv[iVar8];
    }
  }
  greatest_run_suite(generic_pack_unpack_le,"generic_pack_unpack_le");
  greatest_run_suite(generic_pack_unpack_be,"generic_pack_unpack_be");
  greatest_run_suite(generic_mixed_endian,"generic_mixed_endian");
  greatest_run_suite(plan,"plan");
  if ((greatest_info.flags & 2) == 0) {
    update_counts_and_reset_suite();
    greatest_info.end = clock();
    if (greatest_info.end == -1) {
      pcVar6 = "greatest_info.end";
      greatest_info.end = -1;
      goto LAB_00106948;
    }
    pcVar7 = "s";
    pcVar6 = "s";
    if (greatest_info.tests_run == 1) {
      pcVar6 = "";
    }
    fprintf(_stdout,"\nTotal: %u test%s",(ulong)greatest_info.tests_run,pcVar6);
    fprintf(_stdout," (%lu ticks, %.3f sec)",
            (double)(greatest_info.end - greatest_info.begin) / 1000000.0);
    if (greatest_info.assertions == 1) {
      pcVar7 = "";
    }
    fprintf(_stdout,", %u assertion%s\n",(ulong)greatest_info.assertions,pcVar7);
    fprintf(_stdout,"Pass: %u, fail: %u, skip: %u.\n",(ulong)greatest_info.passed,
            (ulong)greatest_info.failed,(ulong)greatest_info.skipped);
  }
  return (int)(greatest_info.failed != 0);
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}